

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::CallInst::display(CallInst *this,ostream *o)

{
  ostream *poVar1;
  pointer pVVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  poVar1 = std::operator<<(o," = ");
  poVar1 = std::operator<<(poVar1,(string *)&this->func);
  std::operator<<(poVar1,"(");
  lVar3 = 0;
  for (uVar4 = 0;
      pVVar2 = (this->params).
               super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->params).
                            super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5);
      uVar4 = uVar4 + 1) {
    if (uVar4 != 0) {
      std::operator<<(o,", ");
      pVVar2 = (this->params).
               super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    (*(code *)**(undefined8 **)((long)&(pVVar2->super_Displayable)._vptr_Displayable + lVar3))
              ((long)&(pVVar2->super_Displayable)._vptr_Displayable + lVar3,o);
    lVar3 = lVar3 + 0x20;
  }
  std::operator<<(o,")");
  return;
}

Assistant:

void CallInst::display(std::ostream& o) const {
  o << dest << " = " << func << "(";
  for (size_t i = 0; i < params.size(); i++) {
    if (i != 0) o << ", ";
    o << params[i];
  }
  o << ")";
}